

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

JsValueRef
WScriptJsrt::ReadLineStdinCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  int iVar1;
  JsErrorCode JVar2;
  int iVar3;
  PAL_FILE *file;
  char *pcVar4;
  char *__ptr;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  JsValueRef local_38;
  JsValueRef emptyStringObject;
  JsValueRef stringObject;
  
  file = PAL_get_stdin(0);
  pcVar4 = (char *)malloc(0x100);
  if (pcVar4 != (char *)0x0) {
    iVar3 = 0x100;
    iVar9 = 0;
    while( true ) {
      __ptr = pcVar4;
      iVar1 = JsFgets(__ptr + iVar9,iVar3 - iVar9,file);
      iVar7 = iVar9;
      if (iVar1 < 1) break;
      iVar7 = iVar1 + iVar9 + -2;
      lVar8 = (long)iVar7;
      iVar6 = iVar1 + -1 + iVar9;
      lVar5 = (long)iVar6;
      if ((__ptr[lVar8] == '\r') && (__ptr[lVar5] == '\n')) {
        __ptr[lVar5] = '\0';
LAB_001113b8:
        __ptr[lVar8] = '\0';
        break;
      }
      lVar8 = lVar5;
      iVar7 = iVar6;
      if (__ptr[lVar5] == '\n') goto LAB_001113b8;
      iVar7 = iVar9 + iVar1;
      if (iVar7 < iVar3 + -1) break;
      iVar3 = iVar3 * 2;
      if ((iVar3 <= iVar7) ||
         (pcVar4 = (char *)realloc(__ptr,(long)iVar3), iVar9 = iVar7, pcVar4 == (char *)0x0))
      goto LAB_00111413;
    }
    if (iVar7 == 0) {
      iVar3 = PAL_feof(file);
      if ((iVar3 == 0) &&
         (JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)(__ptr,0,&local_38),
         JVar2 == JsNoError)) {
        free(__ptr);
        return local_38;
      }
    }
    else {
      JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateString)
                        (__ptr,(long)iVar7,&emptyStringObject);
      if (JVar2 == JsNoError) {
        free(__ptr);
        return emptyStringObject;
      }
    }
LAB_00111413:
    free(__ptr);
  }
  return (JsValueRef)0x0;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::ReadLineStdinCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    const int BUFSIZE = 256;
    FILE* from = stdin;
    int buflength = 0;
    int bufsize = BUFSIZE;
    char* buf = static_cast<char*>(malloc(bufsize));
    char* tmp;
    int gotlength = 0;

    if (!buf)
    {
        goto Error;
    }

    while ((gotlength = JsFgets(buf + buflength, bufsize - buflength, from)) > 0) 
    {
        buflength += gotlength;

        // are we done?
        if (buf[buflength - 2] == '\r' && buf[buflength - 1] == '\n') 
        {
            buf[buflength - 1] = '\0';
            buf[buflength - 2] = '\0';
            buflength -= 2;
            break;
        }
        else if (buf[buflength - 1] == '\n') 
        {
            buf[buflength - 1] = '\0';
            buflength -= 1;
            break;
        }
        else if (buflength < bufsize - 1) 
        {
            break;
        }

        // Else, grow our buffer for another pass.
        bufsize *= 2;
        if (bufsize > buflength) 
        {
            tmp = static_cast<char*>(realloc(buf, bufsize));
        }
        else 
        {
            goto Error;
        }

        if (!tmp) 
        {
            goto Error;
        }

        buf = tmp;
    }

    //Treat the empty string specially.
    if (buflength == 0) 
    {
        if (feof(from)) 
        {
            goto Error;
        }
        else 
        {
            JsValueRef emptyStringObject;
            IfJsrtErrorSetGo(ChakraRTInterface::JsCreateString(buf, buflength, &emptyStringObject));
            free(buf);
            return emptyStringObject;
        }
    }

   
    // Turn buf into a JSString. Note that buflength includes the trailing null character.
    JsValueRef stringObject;
    IfJsrtErrorSetGo(ChakraRTInterface::JsCreateString(buf, buflength, &stringObject));
    free(buf);
    return stringObject;

Error:
    if (buf)
    {
        free(buf);
    }
    return returnValue;
}